

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_ecdsa_adaptor_decrypt
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *deckey32,
              uchar *adaptor_sig162)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  int vflag;
  int overflow;
  secp256k1_scalar s;
  secp256k1_scalar sp;
  secp256k1_scalar deckey;
  secp256k1_scalar sigr;
  int local_bc;
  secp256k1_scalar local_b8;
  secp256k1_scalar local_98;
  secp256k1_scalar local_78;
  secp256k1_scalar local_50;
  
  if (sig == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_ecdsa_adaptor_decrypt_cold_3();
  }
  else if (deckey32 == (uchar *)0x0) {
    secp256k1_ecdsa_adaptor_decrypt_cold_2();
  }
  else {
    if (adaptor_sig162 != (uchar *)0x0) {
      local_98.d[2] = 0;
      local_98.d[3] = 0;
      local_98.d[0] = 0;
      local_98.d[1] = 0;
      secp256k1_scalar_set_b32(&local_78,deckey32,&local_bc);
      lVar5 = 0;
      iVar1 = secp256k1_ecdsa_adaptor_sig_deserialize
                        ((secp256k1_ge *)0x0,&local_50,(secp256k1_ge *)0x0,&local_98,
                         (secp256k1_scalar *)0x0,(secp256k1_scalar *)0x0,adaptor_sig162);
      if (local_bc != 0) {
        iVar1 = 0;
      }
      if (((local_78.d[1] == 0 && local_78.d[0] == 0) && local_78.d[2] == 0) && local_78.d[3] == 0)
      {
        iVar1 = 0;
      }
      secp256k1_scalar_inverse(&local_b8,&local_78);
      secp256k1_scalar_mul(&local_b8,&local_b8,&local_98);
      uVar2 = (uint)(local_b8.d[3] >> 0x3f);
      uVar3 = uVar2 ^ 1;
      uVar4 = uVar3;
      if (local_b8.d[2] == 0xffffffffffffffff) {
        uVar4 = 0;
      }
      if (0x5d576e7357a4501c < local_b8.d[1]) {
        uVar3 = 0;
      }
      uVar3 = (uVar3 | uVar4 | local_b8.d[3] < 0x7fffffffffffffff) ^ 1;
      uVar4 = 0;
      if (0xdfe92f46681b20a0 < local_b8.d[0]) {
        uVar4 = uVar3;
      }
      if (0x5d576e7357a4501d < local_b8.d[1]) {
        uVar4 = uVar3;
      }
      secp256k1_scalar_cond_negate(&local_b8,uVar4 | uVar2);
      *(uint64_t *)sig->data = local_50.d[0];
      *(uint64_t *)(sig->data + 8) = local_50.d[1];
      *(uint64_t *)(sig->data + 0x10) = local_50.d[2];
      *(uint64_t *)(sig->data + 0x18) = local_50.d[3];
      *(uint64_t *)(sig->data + 0x20) = local_b8.d[0];
      *(uint64_t *)(sig->data + 0x28) = local_b8.d[1];
      *(uint64_t *)(sig->data + 0x30) = local_b8.d[2];
      *(uint64_t *)(sig->data + 0x38) = local_b8.d[3];
      do {
        sig->data[lVar5] = sig->data[lVar5] & ((byte)iVar1 ^ 1) - 1;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      return iVar1;
    }
    secp256k1_ecdsa_adaptor_decrypt_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ecdsa_adaptor_decrypt(const secp256k1_context* ctx, secp256k1_ecdsa_signature *sig, const unsigned char *deckey32, const unsigned char *adaptor_sig162) {
    secp256k1_scalar deckey;
    secp256k1_scalar sp;
    secp256k1_scalar s;
    secp256k1_scalar sigr;
    int overflow;
    int high;
    int ret = 1;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(deckey32 != NULL);
    ARG_CHECK(adaptor_sig162 != NULL);

    secp256k1_scalar_clear(&sp);
    secp256k1_scalar_set_b32(&deckey, deckey32, &overflow);
    ret &= !overflow;
    ret &= secp256k1_ecdsa_adaptor_sig_deserialize(NULL, &sigr, NULL, &sp, NULL, NULL, adaptor_sig162);
    ret &= !secp256k1_scalar_is_zero(&deckey);
    secp256k1_scalar_inverse(&s, &deckey);
    /* s = s' * y⁻¹ */
    secp256k1_scalar_mul(&s, &s, &sp);
    high = secp256k1_scalar_is_high(&s);
    secp256k1_scalar_cond_negate(&s, high);
    secp256k1_ecdsa_signature_save(sig, &sigr, &s);

    secp256k1_memczero(&sig->data[0], 64, !ret);
    secp256k1_scalar_clear(&deckey);
    secp256k1_scalar_clear(&sp);
    secp256k1_scalar_clear(&s);

    return ret;
}